

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall libchars::editor::edit(editor *this,string *str,size_t timeout_s)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined1 local_4070 [4];
  int r;
  edit_object O_tmp;
  size_t timeout_s_local;
  string *str_local;
  editor *this_local;
  
  O_tmp.prompt_rendered = timeout_s;
  edit_object::edit_object((edit_object *)local_4070,MODE_STRING,str);
  iVar1 = edit(this,(edit_object *)local_4070,O_tmp.prompt_rendered);
  if (iVar1 == 0) {
    sVar2 = edit_object::length((edit_object *)local_4070);
    if (sVar2 != 0) {
      pcVar3 = edit_object::data((edit_object *)local_4070);
      if (pcVar3 != (char *)0x0) {
        pcVar3 = edit_object::data((edit_object *)local_4070);
        edit_object::length((edit_object *)local_4070);
        std::__cxx11::string::assign((char *)str,(ulong)pcVar3);
      }
    }
  }
  edit_object::~edit_object((edit_object *)local_4070);
  return iVar1;
}

Assistant:

int editor::edit(std::string &str, size_t timeout_s)
    {
        edit_object O_tmp(MODE_STRING,str);
        int r = edit(O_tmp, timeout_s);
        if (r == 0 && O_tmp.length() > 0 && O_tmp.data() != NULL)
            str.assign(O_tmp.data(),O_tmp.length());
        return r;
    }